

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_ec_point_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  undefined4 uVar1;
  undefined4 uVar2;
  SSL_CIPHER *pSVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  CBB *out_00;
  undefined1 auVar7 [16];
  
  out_00 = out;
  uVar5 = ssl_protocol_version(hs->ssl);
  if ((uVar5 < 0x304) &&
     (pSVar3 = hs->new_cipher, uVar1 = pSVar3->algorithm_mkey, uVar2 = pSVar3->algorithm_auth,
     auVar7._0_4_ = -(uint)((uVar1 & 2) == 2), auVar7._4_4_ = -(uint)((uVar1 & 2) == 2),
     auVar7._8_4_ = -(uint)((uVar2 & 4) == 4), auVar7._12_4_ = -(uint)((uVar2 & 4) == 4),
     iVar6 = movmskpd((int)pSVar3,auVar7), iVar6 != 0)) {
    bVar4 = ext_ec_point_add_extension((SSL_HANDSHAKE *)out,out_00);
    return bVar4;
  }
  return true;
}

Assistant:

static bool ext_ec_point_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return true;
  }

  const uint32_t alg_k = hs->new_cipher->algorithm_mkey;
  const uint32_t alg_a = hs->new_cipher->algorithm_auth;
  const bool using_ecc = (alg_k & SSL_kECDHE) || (alg_a & SSL_aECDSA);

  if (!using_ecc) {
    return true;
  }

  return ext_ec_point_add_extension(hs, out);
}